

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  ogg_int32_t *poVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  int local_50;
  int j_1;
  int i_1;
  int shift;
  ogg_int32_t *t;
  int local_38;
  int entry;
  int j;
  int i;
  int point_local;
  int n_local;
  oggpack_buffer *b_local;
  ogg_int32_t *a_local;
  codebook *book_local;
  
  if (book->used_entries < 1) {
    local_50 = 0;
    while (local_50 < n) {
      while (0 < book->dim) {
        a[local_50] = 0;
        local_50 = local_50 + 1;
      }
    }
  }
  else {
    iVar3 = point - book->binarypoint;
    bVar5 = (byte)iVar3;
    if (iVar3 < 0) {
      entry = 0;
      while (entry < n) {
        lVar4 = decode_packed_entry_number(book,b);
        if ((int)lVar4 == -1) {
          return -1;
        }
        poVar1 = book->valuelist;
        lVar2 = book->dim;
        local_38 = 0;
        while ((long)local_38 < book->dim) {
          a[entry] = poVar1[(int)lVar4 * lVar2 + (long)local_38] << (-bVar5 & 0x1f);
          local_38 = local_38 + 1;
          entry = entry + 1;
        }
      }
    }
    else {
      entry = 0;
      while (entry < n) {
        lVar4 = decode_packed_entry_number(book,b);
        if ((int)lVar4 == -1) {
          return -1;
        }
        poVar1 = book->valuelist;
        lVar2 = book->dim;
        local_38 = 0;
        while ((long)local_38 < book->dim) {
          a[entry] = poVar1[(int)lVar4 * lVar2 + (long)local_38] >> (bVar5 & 0x1f);
          local_38 = local_38 + 1;
          entry = entry + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodev_set(codebook *book,ogg_int32_t *a,
			     oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){
    int i,j,entry;
    ogg_int32_t *t;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]>>shift;
	}
      }
    }else{
      
      for(i=0;i<n;){
	entry = decode_packed_entry_number(book,b);
	if(entry==-1)return(-1);
	t     = book->valuelist+entry*book->dim;
	for (j=0;j<book->dim;){
	  a[i++]=t[j++]<<-shift;
	}
      }
    }
  }else{

    int i,j;
    for(i=0;i<n;){
      for (j=0;j<book->dim;){
	a[i++]=0;
      }
    }
  }
  return(0);
}